

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::GenNamespaceImports(RustGenerator *this,int white_spaces)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator<char> local_2f1;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string basename;
  string noext;
  _Self local_80;
  const_iterator it;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string indent;
  int white_spaces_local;
  RustGenerator *this_local;
  
  indent.field_2._12_4_ = white_spaces;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(long)white_spaces,' ',&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)((long)&it._M_node + 7));
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  if (((((this->super_BaseGenerator).parser_)->opts).generate_all & 1U) == 0) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(&((this->super_BaseGenerator).parser_)->included_files_);
    while( true ) {
      noext.field_2._8_8_ =
           std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&((this->super_BaseGenerator).parser_)->included_files_);
      bVar1 = std::operator!=(&local_80,(_Self *)((long)&noext.field_2 + 8));
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_80);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_80);
        StripExtension((string *)((long)&basename.field_2 + 8),&ppVar3->second);
        StripPath((string *)local_c8,(string *)((long)&basename.field_2 + 8));
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::string
                    ((string *)local_168,
                     (string *)&(((this->super_BaseGenerator).parser_)->opts).include_prefix);
          std::__cxx11::string::pop_back();
          std::operator+(&local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,"use crate::");
          std::operator+(&local_208,&local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          std::operator+(&local_1e8,&local_208,"::");
          std::operator+(&local_1c8,&local_1e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
          std::operator+(&local_1a8,&local_1c8,
                         &(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
          std::operator+(&local_188,&local_1a8,"::*;");
          CodeWriter::operator+=(&this->code_,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)local_168);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prefix.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,"use crate::");
          std::operator+(&local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prefix.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
          std::operator+(&local_108,&local_128,
                         &(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
          std::operator+(&local_e8,&local_108,"::*;");
          CodeWriter::operator+=(&this->code_,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_80);
    }
  }
  std::operator+(&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "use core::mem;");
  CodeWriter::operator+=(&this->code_,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::operator+(&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "use core::cmp::Ordering;");
  CodeWriter::operator+=(&this->code_,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
  CodeWriter::operator+=(&this->code_,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  if (((((this->super_BaseGenerator).parser_)->opts).rust_serialize & 1U) != 0) {
    std::operator+(&local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "extern crate serde;");
    CodeWriter::operator+=(&this->code_,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::operator+(&local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "use self::serde::ser::{Serialize, Serializer, SerializeStruct};");
    CodeWriter::operator+=(&this->code_,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f1);
    CodeWriter::operator+=(&this->code_,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  std::operator+(&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "extern crate flatbuffers;");
  CodeWriter::operator+=(&this->code_,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::operator+(&local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "use self::flatbuffers::{EndianScalar, Follow};");
  CodeWriter::operator+=(&this->code_,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenNamespaceImports(const int white_spaces) {
    // DO not use global attributes (i.e. #![...]) since it interferes
    // with users who include! generated files.
    // See: https://github.com/google/flatbuffers/issues/6261
    std::string indent = std::string(white_spaces, ' ');
    code_ += "";
    if (!parser_.opts.generate_all) {
      for (auto it = parser_.included_files_.begin();
           it != parser_.included_files_.end(); ++it) {
        if (it->second.empty()) continue;
        auto noext = flatbuffers::StripExtension(it->second);
        auto basename = flatbuffers::StripPath(noext);

        if (parser_.opts.include_prefix.empty()) {
          code_ += indent + "use crate::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        } else {
          auto prefix = parser_.opts.include_prefix;
          prefix.pop_back();

          code_ += indent + "use crate::" + prefix + "::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        }
      }
    }
    code_ += indent + "use core::mem;";
    code_ += indent + "use core::cmp::Ordering;";
    code_ += "";
    if (parser_.opts.rust_serialize) {
      code_ += indent + "extern crate serde;";
      code_ +=
          indent +
          "use self::serde::ser::{Serialize, Serializer, SerializeStruct};";
      code_ += "";
    }
    code_ += indent + "extern crate flatbuffers;";
    code_ += indent + "use self::flatbuffers::{EndianScalar, Follow};";
  }